

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O0

int UpnpGetServiceVarStatus
              (UpnpClient_Handle Hnd,char *ActionURL_const,char *VarName_const,char **StVar)

{
  Upnp_Handle_Type UVar1;
  char *VarName;
  char *ActionURL;
  char *StVarPtr;
  Handle_Info *pHStack_30;
  int retVal;
  Handle_Info *SInfo;
  char **StVar_local;
  char *VarName_const_local;
  char *ActionURL_const_local;
  UpnpClient_Handle Hnd_local;
  
  pHStack_30 = (Handle_Info *)0x0;
  StVarPtr._4_4_ = 0;
  if (UpnpSdkInit == 1) {
    SInfo = (Handle_Info *)StVar;
    StVar_local = (char **)VarName_const;
    VarName_const_local = ActionURL_const;
    ActionURL_const_local._0_4_ = Hnd;
    UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0xce8,"Inside UpnpGetServiceVarStatus\n");
    HandleReadLock(".upnp/src/api/upnpapi.c",0xceb);
    UVar1 = GetHandleInfo((UpnpClient_Handle)ActionURL_const_local,&stack0xffffffffffffffd0);
    if (UVar1 == HND_CLIENT) {
      HandleUnlock(".upnp/src/api/upnpapi.c",0xcf4);
      if (ActionURL_const == (char *)0x0) {
        ActionURL_const_local._4_4_ = -0x65;
      }
      else if ((VarName_const == (char *)0x0) || (SInfo == (Handle_Info *)0x0)) {
        ActionURL_const_local._4_4_ = -0x65;
      }
      else {
        StVarPtr._4_4_ = SoapGetServiceVarStatus(ActionURL_const,VarName_const,&ActionURL);
        *(char **)SInfo = ActionURL;
        UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0xd03,"Exiting UpnpGetServiceVarStatus \n"
                  );
        ActionURL_const_local._4_4_ = StVarPtr._4_4_;
      }
    }
    else {
      HandleUnlock(".upnp/src/api/upnpapi.c",0xcf0);
      ActionURL_const_local._4_4_ = -100;
    }
  }
  else {
    ActionURL_const_local._4_4_ = -0x74;
  }
  return ActionURL_const_local._4_4_;
}

Assistant:

int UpnpGetServiceVarStatus(UpnpClient_Handle Hnd,
	const char *ActionURL_const,
	const char *VarName_const,
	DOMString *StVar)
{
	struct Handle_Info *SInfo = NULL;
	int retVal = 0;
	char *StVarPtr;
	char *ActionURL = (char *)ActionURL_const;
	char *VarName = (char *)VarName_const;

	if (UpnpSdkInit != 1) {
		return UPNP_E_FINISH;
	}

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Inside UpnpGetServiceVarStatus\n");

	HandleReadLock(__FILE__, __LINE__);
	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_CLIENT:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		return UPNP_E_INVALID_HANDLE;
	}

	HandleUnlock(__FILE__, __LINE__);

	if (ActionURL == NULL) {
		return UPNP_E_INVALID_PARAM;
	}
	if (VarName == NULL || StVar == NULL) {
		return UPNP_E_INVALID_PARAM;
	}

	retVal = SoapGetServiceVarStatus(ActionURL, VarName, &StVarPtr);
	*StVar = StVarPtr;

	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Exiting UpnpGetServiceVarStatus \n");

	return retVal;
}